

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void db_close_and_remove(void)

{
  fdb_status fVar1;
  size_t metalen;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffff9d8;
  void *in_stack_fffffffffffff9e0;
  fdb_doc **in_stack_fffffffffffff9e8;
  size_t in_stack_fffffffffffffa00;
  undefined1 local_590 [248];
  char local_498 [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  memcpy(&kvs_config.custom_cmp_param,local_590,0xf8);
  fdb_get_default_kvs_config();
  fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,(fdb_config *)bodybuf._136_8_
          );
  fdb_kvs_open((fdb_file_handle *)bodybuf._40_8_,(fdb_kvs_handle **)bodybuf._32_8_,
               (char *)bodybuf._24_8_,(fdb_kvs_config *)bodybuf._16_8_);
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(local_498,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x10c915;
    metalen = strlen(local_498);
    fdb_doc_create(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                   (size_t)in_stack_fffffffffffff9d8,meta,metalen,(void *)0x10c94c,
                   in_stack_fffffffffffffa00);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff9d8 + (long)n * 8));
    fdb_doc_free((fdb_doc *)0x10c976);
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff9d8,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x4f3);
    db_close_and_remove::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x4f3,"void db_close_and_remove()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffff9d8);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff9d8);
  system("rm -rf  dummy* > errorlog.txt");
  fVar1 = fdb_open((fdb_file_handle **)bodybuf._152_8_,(char *)bodybuf._144_8_,
                   (fdb_config *)bodybuf._136_8_);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x500);
    db_close_and_remove::__test_pass = 0;
    if (fVar1 != FDB_RESULT_NO_SUCH_FILE) {
      __assert_fail("status == FDB_RESULT_NO_SUCH_FILE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x500,"void db_close_and_remove()");
    }
  }
  fdb_shutdown();
  memleak_end();
  if (db_close_and_remove::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","db close and remove");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","db close and remove");
  }
  return;
}

Assistant:

void db_close_and_remove()
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], metabuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.cleanup_cache_onclose = false;
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // write to db
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // remove dbfile
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // re-open read-only
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("db close and remove");
}